

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcSim.c
# Opt level: O0

void Wlc_NtkSimulatePrint(Wlc_Ntk_t *p,Vec_Int_t *vNodes,Vec_Ptr_t *vRes,int nWords,int nFrames)

{
  int iVar1;
  uint uVar2;
  Wlc_Obj_t *p_00;
  uint *p_01;
  word *pInfo;
  int local_48;
  int nBits;
  int iPat;
  int k;
  int i;
  int b;
  int w;
  int f;
  Wlc_Obj_t *pWlcObj;
  int nFrames_local;
  int nWords_local;
  Vec_Ptr_t *vRes_local;
  Vec_Int_t *vNodes_local;
  Wlc_Ntk_t *p_local;
  
  local_48 = 0;
  b = 0;
  while (b < nFrames) {
    for (i = 0; i < nWords; i = i + 1) {
      k = 0;
      while (k < 0x40) {
        for (iPat = 0; iVar1 = Vec_IntSize(vNodes), iPat < iVar1; iPat = iPat + 1) {
          iVar1 = Vec_IntEntry(vNodes,iPat);
          p_00 = Wlc_NtkObj(p,iVar1);
          nBits = Wlc_ObjRange(p_00);
          while (nBits = nBits + -1, -1 < nBits) {
            p_01 = (uint *)Vec_VecEntryEntry((Vec_Vec_t *)vRes,iPat,nBits);
            uVar2 = Abc_InfoHasBit(p_01,local_48);
            printf("%d",(ulong)uVar2);
          }
          printf(" ");
        }
        k = k + 1;
        local_48 = local_48 + 1;
        printf("\n");
      }
    }
    b = b + 1;
    printf("\n");
  }
  return;
}

Assistant:

void Wlc_NtkSimulatePrint( Wlc_Ntk_t * p, Vec_Int_t * vNodes, Vec_Ptr_t * vRes, int nWords, int nFrames )
{
    Wlc_Obj_t * pWlcObj; 
    int f, w, b, i, k, iPat = 0;
    for ( f = 0; f < nFrames; f++, printf("\n") )
      for ( w = 0; w < nWords; w++ )
        for ( b = 0; b < 64; b++, iPat++, printf("\n") )
        {
            Wlc_NtkForEachObjVec( vNodes, p, pWlcObj, i )
            {
                int nBits = Wlc_ObjRange(pWlcObj);
                for ( k = nBits-1; k >= 0; k-- )
                {
                    word * pInfo = (word*)Vec_VecEntryEntry( (Vec_Vec_t *)vRes, i, k );
                    printf( "%d", Abc_InfoHasBit((unsigned *)pInfo, iPat) );
                }
                printf( " " );
            }
        }
}